

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O2

void av1_quantize_lp_avx2
               (int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *round_ptr,int16_t *quant_ptr,
               int16_t *qcoeff_ptr,int16_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,
               int16_t *scan,int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  auVar1 = *(undefined1 (*) [16])round_ptr;
  auVar2 = *(undefined1 (*) [16])quant_ptr;
  auVar3 = *(undefined1 (*) [16])dequant_ptr;
  auVar11 = vpabsw_avx2(*(undefined1 (*) [32])coeff_ptr);
  auVar8 = vpermq_avx2(ZEXT1632(auVar1),0x54);
  auVar11 = vpaddsw_avx2(auVar11,auVar8);
  auVar8 = vpermq_avx2(ZEXT1632(auVar2),0x54);
  auVar11 = vpmulhw_avx2(auVar11,auVar8);
  auVar6 = vpsignw_avx2(auVar11,*(undefined1 (*) [32])coeff_ptr);
  auVar8 = vpermq_avx2(ZEXT1632(auVar3),0x54);
  auVar8 = vpmullw_avx2(auVar6,auVar8);
  auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar11 = vpcmpgtw_avx2(auVar11,auVar12);
  *(undefined1 (*) [32])qcoeff_ptr = auVar6;
  *(undefined1 (*) [32])dqcoeff_ptr = auVar8;
  auVar8 = vpsubw_avx2(*(undefined1 (*) [32])iscan,auVar11);
  auVar8 = vpmaxsw_avx2(auVar8,auVar12);
  auVar11 = vpand_avx2(auVar11,auVar8);
  if (0x10 < n_coeffs) {
    auVar8 = vpermq_avx2(ZEXT1632(auVar1),0x55);
    auVar6 = vpermq_avx2(ZEXT1632(auVar2),0x55);
    auVar9 = vpermq_avx2(ZEXT1632(auVar3),0x55);
    for (uVar10 = 0x10; uVar10 < (ulong)n_coeffs; uVar10 = uVar10 + 0x10) {
      auVar4 = vpabsw_avx2(*(undefined1 (*) [32])(coeff_ptr + uVar10));
      auVar4 = vpaddsw_avx2(auVar4,auVar8);
      auVar4 = vpmulhw_avx2(auVar4,auVar6);
      auVar7 = vpsignw_avx2(auVar4,*(undefined1 (*) [32])(coeff_ptr + uVar10));
      auVar5 = vpmullw_avx2(auVar7,auVar9);
      auVar4 = vpcmpgtw_avx2(auVar4,auVar12);
      *(undefined1 (*) [32])(qcoeff_ptr + uVar10) = auVar7;
      *(undefined1 (*) [32])(dqcoeff_ptr + uVar10) = auVar5;
      auVar5 = vpsubw_avx2(*(undefined1 (*) [32])(iscan + uVar10),auVar4);
      auVar4 = vpand_avx2(auVar4,auVar5);
      auVar11 = vpmaxsw_avx2(auVar11,auVar4);
    }
  }
  auVar1 = vpmaxsw_avx(auVar11._0_16_,auVar11._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xe);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  auVar2 = vpshuflw_avx(auVar1,0xe);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  auVar2 = vpshuflw_avx(auVar1,1);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  vpextrw_avx(auVar1,1);
  return;
}

Assistant:

void av1_quantize_lp_avx2(const int16_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *round_ptr, const int16_t *quant_ptr,
                          int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  __m256i eob256 = _mm256_setzero_si256();

  // Setup global values.
  __m256i round256 =
      _mm256_castsi128_si256(_mm_load_si128((const __m128i *)round_ptr));
  __m256i quant256 =
      _mm256_castsi128_si256(_mm_load_si128((const __m128i *)quant_ptr));
  __m256i dequant256 =
      _mm256_castsi128_si256(_mm_load_si128((const __m128i *)dequant_ptr));

  // Populate upper AC values.
  round256 = _mm256_permute4x64_epi64(round256, 0x54);
  quant256 = _mm256_permute4x64_epi64(quant256, 0x54);
  dequant256 = _mm256_permute4x64_epi64(dequant256, 0x54);

  // Process DC and the first 15 AC coeffs.
  quantize_lp_16_first(coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &round256,
                       &quant256, &dequant256, &eob256);

  if (n_coeffs > 16) {
    // Overwrite the DC constants with AC constants
    dequant256 = _mm256_permute2x128_si256(dequant256, dequant256, 0x31);
    quant256 = _mm256_permute2x128_si256(quant256, quant256, 0x31);
    round256 = _mm256_permute2x128_si256(round256, round256, 0x31);

    // AC only loop.
    for (int idx = 16; idx < n_coeffs; idx += 16) {
      quantize_lp_16(coeff_ptr, idx, iscan, qcoeff_ptr, dqcoeff_ptr, &round256,
                     &quant256, &dequant256, &eob256);
    }
  }

  *eob_ptr = accumulate_eob256(eob256);
}